

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
          (QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,
          pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *b,qsizetype n)

{
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar1;
  long lVar2;
  type __last;
  type ppVar3;
  
  __last = b + n;
  ppVar1 = (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).ptr
  ;
  lVar2 = (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).size
  ;
  ppVar3 = ppVar1 + lVar2;
  if (__last == ppVar3 || ppVar1 != b) {
    for (; __last = b + n, __last != ppVar3; b = b + 1) {
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::operator=(b,__last);
    }
    lVar2 = (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).
            size;
  }
  else {
    (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).ptr =
         __last;
  }
  (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).size =
       lVar2 - n;
  std::_Destroy_aux<false>::__destroy<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>*>(b,__last);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }